

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

intvector sptk::swipe::primes(int n)

{
  intvector yr_vector;
  int iVar1;
  intvector iVar2;
  intvector iVar3;
  intvector iVar4;
  intvector myOnes;
  int j;
  int i;
  intvector myPrimes;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uStack_2c;
  int local_1c;
  int local_18;
  
  local_1c = 0;
  iVar2 = onesiv(0);
  iVar1 = iVar2.x;
  iVar3.v._4_4_ = uStack_2c;
  iVar3.v._0_4_ = iVar1;
  iVar3._0_8_ = in_stack_ffffffffffffffb8;
  sieve(iVar3);
  iVar3 = makeiv(0);
  iVar4.v = iVar3.v;
  iVar4.x = iVar3.x;
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    if (iVar2.v[local_18] == 1) {
      iVar4.v[local_1c] = local_18 + 1;
      local_1c = local_1c + 1;
    }
  }
  yr_vector._4_4_ = uStack_2c;
  yr_vector.x = iVar1;
  yr_vector.v = iVar2.v;
  freeiv(yr_vector);
  iVar4._4_4_ = 0;
  return iVar4;
}

Assistant:

intvector primes(int n) {
    int i, j = 0;
    intvector myOnes = onesiv(n);
    intvector myPrimes = makeiv(sieve(myOnes)); // size of the # of primes
    for (i = 0; i < myOnes.x; i++) // could start at 1
        if PRIME(myOnes.v[i])
            myPrimes.v[j++] = i + 1;
    freeiv(myOnes);
    return(myPrimes);
}